

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O2

bool __thiscall
CoreML::Specification::TreeEnsembleClassifier::MergePartialFromCodedStream
          (TreeEnsembleClassifier *this,CodedInputStream *input)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  bool bVar4;
  uint uVar5;
  uint32 uVar6;
  undefined8 in_RAX;
  TreeEnsembleParameters *value_00;
  StringVector *value_01;
  Int64Vector *value_02;
  char cVar7;
  ulong uVar8;
  int value;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
LAB_001fae5b:
  do {
    pbVar3 = input->buffer_;
    uVar6 = 0;
    if (pbVar3 < input->buffer_end_) {
      bVar2 = *pbVar3;
      uVar8 = (ulong)bVar2;
      pbVar1 = pbVar3 + 1;
      uVar5 = (uint)bVar2;
      if ((char)bVar2 < '\x01') {
        uVar6 = (uint)bVar2;
        if ((input->buffer_end_ <= pbVar1) || (uVar6 = uVar5, (~(uint)*pbVar1 & uVar5) < 0x80))
        goto LAB_001faf7f;
        uVar8 = (ulong)((uVar5 + (uint)*pbVar1 * 0x80) - 0x80);
        input->buffer_ = pbVar3 + 2;
      }
      else {
        input->buffer_ = pbVar1;
      }
      uVar8 = uVar8 | 0x100000000;
    }
    else {
LAB_001faf7f:
      uVar6 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar6);
      uVar8 = 0;
      if (uVar6 - 1 < 0x3fff) {
        uVar8 = 0x100000000;
      }
      uVar8 = uVar6 | uVar8;
    }
    uVar6 = (uint32)uVar8;
    if ((uVar8 & 0x100000000) == 0) {
LAB_001faeb8:
      if (uVar6 == 0) {
        return true;
      }
      if ((uVar6 & 7) == 4) {
        return true;
      }
      bVar4 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar6);
    }
    else {
      uVar5 = (uint)(uVar8 >> 3) & 0x1fffffff;
      cVar7 = (char)uVar8;
      if (uVar5 == 0x65) {
        if (cVar7 == '*') {
          value_02 = mutable_int64classlabels(this);
          bVar4 = google::protobuf::internal::WireFormatLite::
                  ReadMessageNoVirtual<CoreML::Specification::Int64Vector>(input,value_02);
          goto LAB_001faed8;
        }
        goto LAB_001faeb8;
      }
      if (uVar5 == 2) {
        if (cVar7 != '\x10') goto LAB_001faeb8;
        bVar4 = google::protobuf::internal::WireFormatLite::
                ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)14>
                          (input,(int *)((long)&uStack_28 + 4));
        if (!bVar4) {
          return false;
        }
        this->postevaluationtransform_ = uStack_28._4_4_;
        goto LAB_001fae5b;
      }
      if (uVar5 == 100) {
        if (cVar7 != '\"') goto LAB_001faeb8;
        value_01 = mutable_stringclasslabels(this);
        bVar4 = google::protobuf::internal::WireFormatLite::
                ReadMessageNoVirtual<CoreML::Specification::StringVector>(input,value_01);
      }
      else {
        if ((uVar5 != 1) || (cVar7 != '\n')) goto LAB_001faeb8;
        value_00 = mutable_treeensemble(this);
        bVar4 = google::protobuf::internal::WireFormatLite::
                ReadMessageNoVirtual<CoreML::Specification::TreeEnsembleParameters>(input,value_00);
      }
    }
LAB_001faed8:
    if (bVar4 == false) {
      return false;
    }
  } while( true );
}

Assistant:

bool TreeEnsembleClassifier::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.TreeEnsembleClassifier)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // .CoreML.Specification.TreeEnsembleParameters treeEnsemble = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_treeensemble()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.TreeEnsemblePostEvaluationTransform postEvaluationTransform = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          set_postevaluationtransform(static_cast< ::CoreML::Specification::TreeEnsemblePostEvaluationTransform >(value));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.StringVector stringClassLabels = 100;
      case 100: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(802u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_stringclasslabels()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.Int64Vector int64ClassLabels = 101;
      case 101: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(810u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_int64classlabels()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.TreeEnsembleClassifier)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.TreeEnsembleClassifier)
  return false;
#undef DO_
}